

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactContainerSMC.cpp
# Opt level: O2

void __thiscall chrono::ChContactContainerSMC::ChContactContainerSMC(ChContactContainerSMC *this)

{
  undefined1 auVar1 [16];
  
  ChContactContainer::ChContactContainer(&this->super_ChContactContainer);
  (this->super_ChContactContainer).super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChContactContainerSMC_01160ac0;
  (this->contactlist_3_3).
  super__List_base<chrono::ChContactSMC<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->contactlist_3_3;
  (this->contactlist_3_3).
  super__List_base<chrono::ChContactSMC<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->contactlist_3_3;
  (this->contactlist_3_3).
  super__List_base<chrono::ChContactSMC<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>_*>_>
  ._M_impl._M_node._M_size = 0;
  (this->contactlist_6_3).
  super__List_base<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->contactlist_6_3;
  (this->contactlist_6_3).
  super__List_base<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->contactlist_6_3;
  (this->contactlist_6_3).
  super__List_base<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*>_>
  ._M_impl._M_node._M_size = 0;
  (this->contactlist_6_6).
  super__List_base<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->contactlist_6_6;
  (this->contactlist_6_6).
  super__List_base<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->contactlist_6_6;
  (this->contactlist_6_6).
  super__List_base<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*>_>
  ._M_impl._M_node._M_size = 0;
  (this->contactlist_333_3).
  super__List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->contactlist_333_3;
  (this->contactlist_333_3).
  super__List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->contactlist_333_3;
  (this->contactlist_333_3).
  super__List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*>_>
  ._M_impl._M_node._M_size = 0;
  (this->contactlist_333_6).
  super__List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<6>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->contactlist_333_6;
  (this->contactlist_333_6).
  super__List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<6>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->contactlist_333_6;
  (this->contactlist_333_6).
  super__List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<6>_>_*>_>
  ._M_impl._M_node._M_size = 0;
  (this->contactlist_333_333).
  super__List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->contactlist_333_333;
  (this->contactlist_333_333).
  super__List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->contactlist_333_333;
  (this->contactlist_333_333).
  super__List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>_*>_>
  ._M_impl._M_node._M_size = 0;
  (this->contactlist_666_3).
  super__List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->contactlist_666_3;
  (this->contactlist_666_3).
  super__List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->contactlist_666_3;
  (this->contactlist_666_3).
  super__List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>_*>_>
  ._M_impl._M_node._M_size = 0;
  (this->contactlist_666_6).
  super__List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<6>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->contactlist_666_6;
  (this->contactlist_666_6).
  super__List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<6>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->contactlist_666_6;
  (this->contactlist_666_6).
  super__List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<6>_>_*>_>
  ._M_impl._M_node._M_size = 0;
  (this->contactlist_666_333).
  super__List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->contactlist_666_333;
  (this->contactlist_666_333).
  super__List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->contactlist_666_333;
  (this->contactlist_666_333).
  super__List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>_*>_>
  ._M_impl._M_node._M_size = 0;
  (this->contactlist_666_666).
  super__List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->contactlist_666_666;
  (this->contactlist_666_666).
  super__List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->contactlist_666_666;
  (this->lastcontact_6_6)._M_node = (_List_node_base *)0x0;
  (this->lastcontact_333_3)._M_node = (_List_node_base *)0x0;
  (this->lastcontact_333_6)._M_node = (_List_node_base *)0x0;
  (this->lastcontact_333_333)._M_node = (_List_node_base *)0x0;
  (this->lastcontact_666_3)._M_node = (_List_node_base *)0x0;
  (this->lastcontact_666_6)._M_node = (_List_node_base *)0x0;
  (this->lastcontact_666_333)._M_node = (_List_node_base *)0x0;
  (this->lastcontact_666_666)._M_node = (_List_node_base *)0x0;
  (this->contactlist_666_666).
  super__List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>_*>_>
  ._M_impl._M_node._M_size = 0;
  this->n_added_3_3 = 0;
  this->n_added_6_3 = 0;
  this->n_added_6_6 = 0;
  this->n_added_333_3 = 0;
  this->n_added_333_6 = 0;
  this->n_added_333_333 = 0;
  this->n_added_666_3 = 0;
  this->n_added_666_6 = 0;
  this->n_added_666_333 = 0;
  this->n_added_666_666 = 0;
  (this->lastcontact_3_3)._M_node = (_List_node_base *)0x0;
  (this->lastcontact_6_3)._M_node = (_List_node_base *)0x0;
  auVar1 = ZEXT416(0) << 0x40;
  (this->contact_forces)._M_h._M_buckets = &(this->contact_forces)._M_h._M_single_bucket;
  (this->contact_forces)._M_h._M_bucket_count = 1;
  (this->contact_forces)._M_h._M_before_begin = (__node_base)auVar1._0_8_;
  (this->contact_forces)._M_h._M_element_count = auVar1._8_8_;
  (this->contact_forces)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])&(this->contact_forces)._M_h._M_rehash_policy._M_next_resize = auVar1;
  return;
}

Assistant:

ChContactContainerSMC::ChContactContainerSMC()
    : n_added_3_3(0),
      n_added_6_3(0),
      n_added_6_6(0),
      n_added_333_3(0),
      n_added_333_6(0),
      n_added_333_333(0),
      n_added_666_3(0),
      n_added_666_6(0),
      n_added_666_333(0),
      n_added_666_666(0) {}